

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_pileup_engine.cpp
# Opt level: O2

void __thiscall
BamTools::PileupEngine::PileupEnginePrivate::CreatePileupData(PileupEnginePrivate *this)

{
  pointer pBVar1;
  int iVar2;
  pointer al;
  
  ClearOldData(this);
  iVar2 = this->CurrentPosition;
  (this->CurrentPileupData).RefId = this->CurrentId;
  (this->CurrentPileupData).Position = iVar2;
  std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>::clear
            (&(this->CurrentPileupData).PileupAlignments);
  pBVar1 = (this->CurrentAlignments).
           super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (al = (this->CurrentAlignments).
            super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
            _M_impl.super__Vector_impl_data._M_start; al != pBVar1; al = al + 1) {
    ParseAlignmentCigar(this,al);
  }
  return;
}

Assistant:

void PileupEngine::PileupEnginePrivate::CreatePileupData()
{

    // remove any non-overlapping alignments
    ClearOldData();

    // set pileup refId, position to current markers
    CurrentPileupData.RefId = CurrentId;
    CurrentPileupData.Position = CurrentPosition;
    CurrentPileupData.PileupAlignments.clear();

    // parse CIGAR data in remaining alignments
    std::vector<BamAlignment>::const_iterator alIter = CurrentAlignments.begin();
    std::vector<BamAlignment>::const_iterator alEnd = CurrentAlignments.end();
    for (; alIter != alEnd; ++alIter) {
        ParseAlignmentCigar((*alIter));
    }
}